

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

APInt __thiscall llvm::detail::IEEEFloat::convertHalfAPFloatToAPInt(IEEEFloat *this)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  long *in_RSI;
  APInt AVar4;
  
  if ((undefined1 *)*in_RSI != semIEEEhalf) {
    __assert_fail("semantics == (const llvm::fltSemantics*)&semIEEEhalf",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xb98,"APInt llvm::detail::IEEEFloat::convertHalfAPFloatToAPInt() const");
  }
  bVar1 = *(byte *)((long)in_RSI + 0x12);
  uVar3 = bVar1 & 7;
  if (uVar3 == 3 || (bVar1 & 6) == 0) {
    uVar2 = 0;
    if (uVar3 == 3) {
      uVar3 = 0;
    }
    else {
      if (uVar3 == 1) {
        uVar2 = *(uint *)(in_RSI + 1);
      }
      else if ((bVar1 & 7) != 0) {
        __assert_fail("category == fcNaN && \"Unknown category!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0xba9,"APInt llvm::detail::IEEEFloat::convertHalfAPFloatToAPInt() const");
      }
      uVar3 = 0x1f;
    }
  }
  else {
    uVar3 = (int)(short)in_RSI[2] + 0xf;
    uVar2 = *(uint *)(in_RSI + 1);
    if (uVar3 == 1) {
      uVar3 = uVar2 >> 10 & 1;
    }
  }
  AVar4.BitWidth = (uVar3 & 0x1f) << 10;
  *(undefined4 *)&this->significand = 0x10;
  this->semantics = (fltSemantics *)(ulong)((bVar1 & 8) << 0xc | AVar4.BitWidth | uVar2 & 0x3ff);
  AVar4.U.pVal = (uint64_t *)this;
  AVar4._12_4_ = 0;
  return AVar4;
}

Assistant:

APInt IEEEFloat::convertHalfAPFloatToAPInt() const {
  assert(semantics == (const llvm::fltSemantics*)&semIEEEhalf);
  assert(partCount()==1);

  uint32_t myexponent, mysignificand;

  if (isFiniteNonZero()) {
    myexponent = exponent+15; //bias
    mysignificand = (uint32_t)*significandParts();
    if (myexponent == 1 && !(mysignificand & 0x400))
      myexponent = 0;   // denormal
  } else if (category==fcZero) {
    myexponent = 0;
    mysignificand = 0;
  } else if (category==fcInfinity) {
    myexponent = 0x1f;
    mysignificand = 0;
  } else {
    assert(category == fcNaN && "Unknown category!");
    myexponent = 0x1f;
    mysignificand = (uint32_t)*significandParts();
  }

  return APInt(16, (((sign&1) << 15) | ((myexponent&0x1f) << 10) |
                    (mysignificand & 0x3ff)));
}